

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::_::BuilderArena::LocalCapTable>::disposeImpl
          (HeapDisposer<capnp::_::BuilderArena::LocalCapTable> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::_::BuilderArena::LocalCapTable> *this_local;
  
  if (pointer != (void *)0x0) {
    ::capnp::_::BuilderArena::LocalCapTable::~LocalCapTable((LocalCapTable *)pointer);
    operator_delete(pointer,0x28);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }